

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

int64_t __thiscall fasttext::Vector::argmax(Vector *this)

{
  float fVar1;
  size_t sVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  size_t sVar5;
  size_t sVar6;
  float fVar7;
  undefined1 auVar8 [64];
  
  sVar2 = (this->data_).size_;
  if (1 < (long)sVar2) {
    pfVar3 = (this->data_).mem_;
    sVar6 = 1;
    sVar5 = 0;
    auVar8 = ZEXT464((uint)*pfVar3);
    do {
      fVar1 = pfVar3[sVar6];
      fVar7 = auVar8._0_4_;
      auVar4 = vmaxss_avx(ZEXT416((uint)fVar1),auVar8._0_16_);
      auVar8 = ZEXT1664(auVar4);
      if (fVar7 < fVar1) {
        sVar5 = sVar6;
      }
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
    return sVar5;
  }
  return 0;
}

Assistant:

int64_t Vector::argmax() {
  real max = data_[0];
  int64_t argmax = 0;
  for (int64_t i = 1; i < size(); i++) {
    if (data_[i] > max) {
      max = data_[i];
      argmax = i;
    }
  }
  return argmax;
}